

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::FilterFederate
          (FilterFederate *this,GlobalFederateId fedID,string *name,GlobalBrokerId coreID,
          Core *param_5)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  BaseType in_ECX;
  GlobalFederateId in_ESI;
  BaseType *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffff1c;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff20;
  MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *this_00;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff28;
  function<void_(const_helics::ActionMessage_&)> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  TimeCoordinator *in_stack_ffffffffffffff60;
  
  *in_RDI = in_ESI.gid;
  in_RDI[1] = in_ECX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::FilterFederate::FilterFederate(helics::GlobalFederateId,std::__cxx11::string,helics::GlobalBrokerId,helics::Core*)::__0,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TimeCoordinator::TimeCoordinator
            (in_stack_ffffffffffffff60,
             (function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff58);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x59c6c4);
  in_RDI[0xa4] = 0;
  in_RDI[0xa5] = 0;
  *(undefined1 *)(in_RDI + 0xa6) = 0;
  std::
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  ::map((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
         *)0x59c6ec);
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff20);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff20);
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff20);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff20);
  std::function<void_(helics::ActionMessage_&)>::function
            ((function<void_(helics::ActionMessage_&)> *)in_stack_ffffffffffffff20);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function(in_stack_ffffffffffffff20);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  function((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
            *)in_stack_ffffffffffffff20);
  std::
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::deque((deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           *)0x59c79c);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)(in_RDI + 0x100) = TVar1.internalTimeCode;
  this_00 = (MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)(in_RDI + 0x102);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x59c7c0);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x59c7d6);
  std::atomic<int>::atomic((atomic<int> *)this_00,in_stack_ffffffffffffff1c);
  *(undefined1 *)(in_RDI + 0x11b) = 0;
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::
  MappedPointerVector(this_00);
  BaseTimeCoordinator::setSourceId((BaseTimeCoordinator *)(in_RDI + 10),in_ESI);
  TimeCoordinator::setOptionFlag((TimeCoordinator *)(in_RDI + 10),0x51,true);
  TimeCoordinator::specifyNonGranting((TimeCoordinator *)(in_RDI + 10),true);
  return;
}

Assistant:

FilterFederate::FilterFederate(GlobalFederateId fedID,
                               std::string name,
                               GlobalBrokerId coreID,
                               Core* /*core*/):
    mFedID(fedID), mCoreID(coreID), mName(std::move(name)), /*mCore(core),*/
    mCoord([this](const ActionMessage& msg) { routeMessage(msg); })
{
    mCoord.setSourceId(fedID);
    mCoord.setOptionFlag(helics::defs::Flags::EVENT_TRIGGERED, true);
    mCoord.specifyNonGranting(true);
}